

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::makeSymbol(Kvm *this,string *str)

{
  bool bVar1;
  pointer ppVar2;
  undefined8 uVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_false,_true>,_bool>
  pVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>
  local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
  local_48;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_false,_true>,_bool>
  r;
  Symbol *s;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
  local_28;
  iterator iter;
  string *str_local;
  Kvm *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
               )str;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>_>_>
       ::find(&this->symbols,str);
  s = (Symbol *)
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>_>_>
      ::end(&this->symbols);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
                      *)&s);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_false,_true>
                           *)&local_28);
    this_local = (Kvm *)ppVar2->second;
  }
  else {
    r._8_8_ = Kgc::allocValue(&this->gc_,SYMBOL);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>
    ::pair<PrimitiveValue<const_char_*,_(ValueType)4>_*&,_true>
              (&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               iter.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
               ._M_cur,(PrimitiveValue<const_char_*,_(ValueType)4> **)&r.second);
    pVar4 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>_>_>
            ::insert(&this->symbols,&local_70);
    local_48._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
         ._M_cur;
    r.first.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_true>
    ._M_cur._0_1_ = pVar4.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>
    ::~pair(&local_70);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Value_*>,_false,_true>
                  *)&local_48);
    uVar3 = std::__cxx11::string::c_str();
    *(undefined8 *)(r._8_8_ + 0x18) = uVar3;
    Kgc::pushStackRoot(&this->gc_,(Value *)r._8_8_);
    this_local = (Kvm *)r._8_8_;
  }
  return (Value *)this_local;
}

Assistant:

const Value*Kvm::makeSymbol(const std::string &str)
{
    auto iter = symbols.find(str);
    if (iter != symbols.end())
    {
        return iter->second;
    } else
    {
        Symbol *s = static_cast<Symbol *>(gc_.allocValue(ValueType::SYMBOL));
        auto r = symbols.insert({str, s});
        s->value_ = r.first->first.c_str();
        gc_.pushStackRoot(s);
        return s;
    }
}